

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

optional<slang::SourceLocation> __thiscall slang::parsing::Trivia::getExplicitLocation(Trivia *this)

{
  TriviaKind TVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar2;
  optional<slang::SourceLocation> oVar3;
  SourceLocation local_40;
  Token local_38;
  SourceLocation local_28;
  Trivia *local_20;
  Trivia *this_local;
  bool local_10;
  
  TVar1 = this->kind;
  local_20 = this;
  if (TVar1 == SkippedTokens) {
    if ((this->field_0).rawText.len == 0) {
      assert::assertFailed
                ("tokens.len",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/parsing/Token.cpp"
                 ,0x79,
                 "std::optional<SourceLocation> slang::parsing::Trivia::getExplicitLocation() const"
                );
    }
    local_40 = Token::location((this->field_0).tokens.ptr);
    std::optional<slang::SourceLocation>::optional<slang::SourceLocation,_true>
              ((optional<slang::SourceLocation> *)&this_local,&local_40);
    uVar2 = extraout_RDX_00;
  }
  else if (TVar1 == SkippedSyntax || TVar1 == Directive) {
    local_38 = slang::syntax::SyntaxNode::getFirstToken((this->field_0).syntaxNode);
    local_28 = Token::location(&local_38);
    std::optional<slang::SourceLocation>::optional<slang::SourceLocation,_true>
              ((optional<slang::SourceLocation> *)&this_local,&local_28);
    uVar2 = extraout_RDX;
  }
  else if ((this->hasFullLocation & 1U) == 0) {
    std::optional<slang::SourceLocation>::optional((optional<slang::SourceLocation> *)&this_local);
    uVar2 = extraout_RDX_02;
  }
  else {
    std::optional<slang::SourceLocation>::optional<slang::SourceLocation_&,_true>
              ((optional<slang::SourceLocation> *)&this_local,
               &((this->field_0).fullLocation)->location);
    uVar2 = extraout_RDX_01;
  }
  oVar3.super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceLocation>._9_7_ = (undefined7)((ulong)uVar2 >> 8);
  oVar3.super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceLocation>._M_engaged = local_10;
  oVar3.super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceLocation>._M_payload =
       (_Storage<slang::SourceLocation,_true>)this_local;
  return (optional<slang::SourceLocation>)
         oVar3.super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
         super__Optional_payload_base<slang::SourceLocation>;
}

Assistant:

std::optional<SourceLocation> Trivia::getExplicitLocation() const {
    switch (kind) {
        case TriviaKind::Directive:
        case TriviaKind::SkippedSyntax:
            return syntaxNode->getFirstToken().location();
        case TriviaKind::SkippedTokens:
            ASSERT(tokens.len);
            return tokens.ptr[0].location();
        default:
            if (hasFullLocation)
                return fullLocation->location;

            return std::nullopt;
    }
}